

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brightness_ctrl.cpp
# Opt level: O0

void __thiscall BrightnessControl::force_adjust(BrightnessControl *this)

{
  size_t sVar1;
  reference pvVar2;
  float fVar3;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_38;
  int local_2c;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_28;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_20;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_18;
  BrightnessControl *local_10;
  BrightnessControl *this_local;
  
  local_10 = this;
  local_20._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(&this->thresh);
  local_28._M_current = (int *)std::vector<int,_std::allocator<int>_>::end(&this->thresh);
  fVar3 = SensorALS::get_value(this->als);
  fVar3 = roundf(fVar3);
  local_2c = (int)fVar3;
  local_18 = std::
             upper_bound<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
                       (local_20,local_28,&local_2c);
  local_38._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(&this->thresh);
  sVar1 = __gnu_cxx::operator-(&local_18,&local_38);
  this->cur = sVar1;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this->value,this->cur);
  brightness_slide(this,*pvVar2);
  return;
}

Assistant:

void BrightnessControl::force_adjust()
{
	cur=std::upper_bound(thresh.begin(),thresh.end(),(int)roundf(als->get_value()))
		-thresh.begin();
	brightness_slide(value[cur]);
}